

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::Return(VM *this,Value *a,Instruction i)

{
  State *pSVar1;
  _List_node_base *p_Var2;
  anon_union_8_9_8deb4486_for_Value_0 *paVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  _List_node_base *top;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  pSVar1 = this->state_;
  if (i.opcode_ << 0x10 != -0x10000) {
    (pSVar1->stack_).top_ = a + ((int)(i.opcode_ << 0x10) >> 0x10);
  }
  if ((pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar1->calls_) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x199,"void luna::VM::Return(Value *, Instruction)");
  }
  p_Var2 = (pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
           _M_impl._M_node.super__List_node_base._M_prev;
  top = p_Var2[1]._M_prev;
  iVar4 = *(int *)&p_Var2[3]._M_next;
  uVar9 = (ulong)((long)(pSVar1->stack_).top_ - (long)a) >> 4;
  iVar7 = (int)uVar9;
  if (iVar4 == -1) {
    uVar5 = 0;
    if (0 < iVar7) {
      uVar5 = uVar9 & 0xffffffff;
    }
    while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
      *(ValueT *)&top->_M_prev = a->type_;
      paVar3 = &a->field_0;
      a = a + 1;
      *(anon_union_8_9_8deb4486_for_Value_0 *)&top->_M_next = *paVar3;
      top = top + 1;
    }
  }
  else {
    if (iVar4 < iVar7) {
      iVar7 = iVar4;
    }
    iVar8 = 0;
    iVar6 = 0;
    if (0 < iVar7) {
      iVar8 = iVar7;
      iVar6 = iVar7;
    }
    while (iVar8 != 0) {
      *(ValueT *)&top->_M_prev = a->type_;
      paVar3 = &a->field_0;
      a = a + 1;
      *(anon_union_8_9_8deb4486_for_Value_0 *)&top->_M_next = *paVar3;
      top = top + 1;
      iVar8 = iVar8 + -1;
    }
    for (; iVar6 < iVar4; iVar6 = iVar6 + 1) {
      ((anon_union_8_9_8deb4486_for_Value_0 *)&top->_M_next)->obj_ = (GCObject *)0x0;
      *(ValueT *)&top->_M_prev = ValueT_Nil;
      top = top + 1;
    }
  }
  Stack::SetNewTop(&this->state_->stack_,(Value *)top);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::pop_back
            (&this->state_->calls_);
  return;
}

Assistant:

void VM::Return(Value *a, Instruction i)
    {
        // Set stack top when return value count is fixed
        int ret_value_count = Instruction::GetParamsBx(i);
        if (ret_value_count != EXP_VALUE_COUNT_ANY)
            state_->stack_.top_ = a + ret_value_count;

        assert(!state_->calls_.empty());
        auto call = &state_->calls_.back();

        auto src = a;
        auto dst = call->func_;

        int expect_result = call->expect_result_;
        int result_count = state_->stack_.top_ - src;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < result_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int i = 0;
            int count = std::min(expect_result, result_count);
            for (; i < count; ++i)
                *dst++ = *src++;
            // No enough results for expect results, set remain as nil
            for (; i < expect_result; ++i, ++dst)
                dst->SetNil();
        }

        // Set new top and pop current CallInfo
        state_->stack_.SetNewTop(dst);
        state_->calls_.pop_back();
    }